

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O1

bool __thiscall Inline::IsArgumentsOpnd(Inline *this,Opnd *opnd)

{
  Opnd *pOVar1;
  bool bVar2;
  StackSym *pSVar3;
  Instr *pIVar4;
  bool bVar5;
  
  bVar5 = opnd != (Opnd *)0x0;
  if (bVar5) {
    bVar2 = IR::Opnd::IsArgumentsObject(opnd);
    while (bVar2 == false) {
      pSVar3 = IR::Opnd::GetStackSym(opnd);
      if ((pSVar3 == (StackSym *)0x0) ||
         (pSVar3 = IR::Opnd::GetStackSym(opnd), (pSVar3->field_0x18 & 1) == 0)) {
        pOVar1 = (Opnd *)0x0;
      }
      else {
        pOVar1 = (Opnd *)0x0;
        if ((pSVar3->field_5).m_instrDef != (Instr *)0x0) {
          pSVar3 = IR::Opnd::GetStackSym(opnd);
          if ((pSVar3->field_0x18 & 1) == 0) {
            pIVar4 = (Instr *)0x0;
          }
          else {
            pIVar4 = (pSVar3->field_5).m_instrDef;
          }
          pOVar1 = pIVar4->m_src1;
        }
      }
      opnd = pOVar1;
      bVar5 = opnd != (Opnd *)0x0;
      if (opnd == (Opnd *)0x0) {
        return bVar5;
      }
      bVar2 = IR::Opnd::IsArgumentsObject(opnd);
    }
  }
  return bVar5;
}

Assistant:

bool
Inline::IsArgumentsOpnd(IR::Opnd* opnd)
{
    IR::Opnd * checkOpnd = opnd;
    while (checkOpnd)
    {
        if (checkOpnd->IsArgumentsObject())
        {
            return true;
        }
        checkOpnd = checkOpnd->GetStackSym() && checkOpnd->GetStackSym()->IsSingleDef() ? checkOpnd->GetStackSym()->GetInstrDef()->GetSrc1() : nullptr;
    }

    return false;
}